

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

Expression * __thiscall
rsg::ConstructorOp::createNextChild(ConstructorOp *this,GeneratorState *state)

{
  ConstValueRangeAccess valueRange;
  GeneratorState *state_00;
  size_type sVar1;
  size_type sVar2;
  exception *anon_var_0;
  ConstValueRangeAccess local_48;
  reference local_30;
  ValueRange *inValueRange;
  Expression *child;
  GeneratorState *pGStack_18;
  int numChildren;
  GeneratorState *state_local;
  ConstructorOp *this_local;
  
  pGStack_18 = state;
  state_local = (GeneratorState *)this;
  sVar1 = std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::size
                    (&this->m_inputExpressions);
  inValueRange = (ValueRange *)0x0;
  child._4_4_ = (int)sVar1;
  sVar2 = std::vector<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>::size
                    (&this->m_inputValueRanges);
  if ((int)sVar1 < (int)sVar2) {
    sVar1 = std::vector<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>::size
                      (&this->m_inputValueRanges);
    local_30 = std::vector<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>::operator[]
                         (&this->m_inputValueRanges,~(long)child._4_4_ + sVar1);
    state_00 = pGStack_18;
    ValueRange::operator_cast_to_ConstValueRangeAccess(&local_48,local_30);
    valueRange.m_min = local_48.m_min;
    valueRange.m_type = local_48.m_type;
    valueRange.m_max = local_48.m_max;
    inValueRange = (ValueRange *)Expression::createRandom(state_00,valueRange);
    std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::push_back
              (&this->m_inputExpressions,(value_type *)&inValueRange);
  }
  return (Expression *)inValueRange;
}

Assistant:

Expression* ConstructorOp::createNextChild (GeneratorState& state)
{
	int					numChildren	= (int)m_inputExpressions.size();
	Expression*			child		= DE_NULL;

	// \note Created in reverse order!
	if (numChildren < (int)m_inputValueRanges.size())
	{
		const ValueRange& inValueRange = m_inputValueRanges[m_inputValueRanges.size()-1-numChildren];
		child = Expression::createRandom(state, inValueRange);
		try
		{
			m_inputExpressions.push_back(child);
		}
		catch (const std::exception&)
		{
			delete child;
			throw;
		}
	}

	return child;
}